

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O3

int __thiscall asmjit::AnonymousMemory::unlink(AnonymousMemory *this,char *__name)

{
  FileType FVar1;
  int in_EAX;
  int iVar2;
  char *pcVar3;
  
  FVar1 = this->_fileType;
  this->_fileType = kFileTypeNone;
  if (FVar1 != kFileTypeTmp) {
    if (FVar1 == kFileTypeShm) {
      if ((this->_tmpName).super_String.field_0._type < 0x1f) {
        pcVar3 = (this->_tmpName).super_String.field_0._small.data;
      }
      else {
        pcVar3 = (this->_tmpName).super_String.field_0._large.data;
      }
      shm_unlink(pcVar3);
    }
    return in_EAX;
  }
  if ((this->_tmpName).super_String.field_0._type < 0x1f) {
    pcVar3 = (this->_tmpName).super_String.field_0._small.data;
  }
  else {
    pcVar3 = (this->_tmpName).super_String.field_0._large.data;
  }
  iVar2 = ::unlink(pcVar3);
  return iVar2;
}

Assistant:

void unlink() noexcept {
    FileType type = _fileType;
    _fileType = kFileTypeNone;

#if ASMJIT_VM_SHM_AVAILABLE
    if (type == kFileTypeShm) {
      ::shm_unlink(_tmpName.data());
      return;
    }
#endif

    if (type == kFileTypeTmp) {
      ::unlink(_tmpName.data());
      return;
    }
  }